

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_writer.cpp
# Opt level: O2

void __thiscall
duckdb::ArrayColumnWriter::Prepare
          (ArrayColumnWriter *this,ColumnWriterState *state_p,ColumnWriterState *parent,
          Vector *vector,idx_t count)

{
  unsafe_vector<uint16_t> *this_00;
  unsafe_vector<uint16_t> *this_01;
  vector<bool,_true> *this_02;
  pointer puVar1;
  ColumnWriterState *pCVar2;
  bool bVar3;
  unsigned_short uVar4;
  idx_t iVar5;
  Vector *pVVar6;
  pointer pCVar7;
  type pCVar8;
  idx_t k_2;
  size_type __n;
  idx_t k;
  ulong uVar9;
  idx_t row_idx;
  reference rVar10;
  unsigned_short local_84;
  unsigned_short local_82;
  idx_t local_80;
  idx_t local_78;
  ColumnWriterState *local_70;
  ColumnWriterState *local_68;
  idx_t local_60;
  Vector *local_58;
  idx_t local_50;
  vector<bool,_true> *local_48;
  TemplatedValidityMask<unsigned_long> *local_40;
  idx_t local_38;
  
  local_80 = ArrayType::GetSize(&vector->type);
  FlatVector::VerifyFlatVector(vector);
  local_78 = count;
  if (parent != (ColumnWriterState *)0x0) {
    local_78 = ((long)(parent->definition_levels).
                      super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(parent->definition_levels).
                      super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start >> 1) -
               (long)state_p[1].definition_levels.
                     super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
  }
  local_40 = &(vector->validity).super_TemplatedValidityMask<unsigned_long>;
  local_48 = &parent->is_empty;
  this_00 = &state_p->definition_levels;
  this_01 = &state_p->repetition_levels;
  this_02 = &state_p->is_empty;
  iVar5 = 0;
  row_idx = 0;
  local_70 = parent;
  local_68 = state_p;
  local_58 = vector;
  local_50 = count;
  do {
    pCVar2 = local_68;
    puVar1 = local_68[1].definition_levels.
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (iVar5 == local_78) {
      local_68[1].definition_levels.super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)((long)puVar1 + local_78);
      pVVar6 = ArrayVector::GetEntry(local_58);
      pCVar7 = unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>::
               operator->(&(this->super_ListColumnWriter).child_writer);
      pCVar8 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
               ::operator*((unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                            *)&pCVar2[1].definition_levels.
                               super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_finish);
      (*pCVar7->_vptr_ColumnWriter[6])(pCVar7,pCVar8,pCVar2,pVVar6,local_80 * local_50);
      return;
    }
    local_60 = row_idx;
    local_38 = iVar5;
    if (local_70 == (ColumnWriterState *)0x0) {
      uVar4 = (unsigned_short)
              ((this->super_ListColumnWriter).super_ColumnWriter.column_schema)->max_repeat;
LAB_01e51d47:
      bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid(local_40,row_idx);
      if (bVar3) {
        ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                  (&this_00->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                   &ColumnWriter::PARQUET_DEFINE_VALID);
        ::std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)this_02,false);
        local_84 = uVar4;
        ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (&this_01->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,&local_84
                  );
        for (uVar9 = 1; uVar9 < local_80; uVar9 = uVar9 + 1) {
          local_84 = (short)(int)((this->super_ListColumnWriter).super_ColumnWriter.column_schema)->
                                 max_repeat + 1;
          ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          emplace_back<unsigned_short>
                    (&this_01->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                     &local_84);
          ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (&this_00->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                     &ColumnWriter::PARQUET_DEFINE_VALID);
          ::std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)this_02,false);
        }
      }
      else {
        local_84 = (short)(int)((this->super_ListColumnWriter).super_ColumnWriter.column_schema)->
                               max_define - 1;
        ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (&this_00->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,&local_84
                  );
        local_84 = uVar4;
        ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (&this_01->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,&local_84
                  );
        ::std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)this_02,false);
        for (uVar9 = 1; uVar9 < local_80; uVar9 = uVar9 + 1) {
          local_84 = (short)(int)((this->super_ListColumnWriter).super_ColumnWriter.column_schema)->
                                 max_repeat + 1;
          ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          emplace_back<unsigned_short>
                    (&this_01->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                     &local_84);
          local_84 = (short)(int)((this->super_ListColumnWriter).super_ColumnWriter.column_schema)->
                                 max_define - 1;
          ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          emplace_back<unsigned_short>
                    (&this_00->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                     &local_84);
          ::std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)this_02,false);
        }
      }
LAB_01e51e57:
      row_idx = local_60 + 1;
    }
    else {
      __n = (long)puVar1 + iVar5;
      if ((((local_70->is_empty).super_vector<bool,_std::allocator<bool>_>.
            super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
            super__Bit_iterator_base._M_p ==
            (local_70->is_empty).super_vector<bool,_std::allocator<bool>_>.
            super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
            super__Bit_iterator_base._M_p) &&
          ((local_70->is_empty).super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
           super__Bit_iterator_base._M_offset == 0)) ||
         (rVar10 = vector<bool,_true>::get<true>(local_48,__n), pCVar2 = local_70,
         (*rVar10._M_p & rVar10._M_mask) == 0)) {
        puVar1 = (local_70->repetition_levels).
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (puVar1 == (local_70->repetition_levels).
                      super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          uVar4 = (unsigned_short)
                  ((this->super_ListColumnWriter).super_ColumnWriter.column_schema)->max_repeat;
        }
        else {
          uVar4 = puVar1[__n];
        }
        puVar1 = (local_70->definition_levels).
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_82 = uVar4;
        if (puVar1[__n] == 0xffff) goto LAB_01e51d47;
        ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                  (&this_00->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                   puVar1 + __n);
        local_84 = local_82;
        ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (&this_01->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,&local_84
                  );
        ::std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)this_02,false);
        for (uVar9 = 1; uVar9 < local_80; uVar9 = uVar9 + 1) {
          local_84 = (short)(int)((this->super_ListColumnWriter).super_ColumnWriter.column_schema)->
                                 max_repeat + 1;
          ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          emplace_back<unsigned_short>
                    (&this_01->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                     &local_84);
          ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (&this_00->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                     (local_70->definition_levels).
                     super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start + __n);
          ::std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)this_02,false);
        }
        goto LAB_01e51e57;
      }
      ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                (&this_00->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                 (local_70->definition_levels).
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start + __n);
      row_idx = local_60;
      ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                (&this_01->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                 (pCVar2->repetition_levels).
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start + __n);
      ::std::vector<bool,_std::allocator<bool>_>::push_back
                ((vector<bool,_std::allocator<bool>_> *)this_02,true);
    }
    iVar5 = local_38 + 1;
  } while( true );
}

Assistant:

void ArrayColumnWriter::Prepare(ColumnWriterState &state_p, ColumnWriterState *parent, Vector &vector, idx_t count) {
	auto &state = state_p.Cast<ListColumnWriterState>();

	auto array_size = ArrayType::GetSize(vector.GetType());
	auto &validity = FlatVector::Validity(vector);

	// write definition levels and repeats
	// the main difference between this and ListColumnWriter::Prepare is that we need to make sure to write out
	// repetition levels and definitions for the child elements of the array even if the array itself is NULL.
	idx_t start = 0;
	idx_t vcount = parent ? parent->definition_levels.size() - state.parent_index : count;
	idx_t vector_index = 0;
	for (idx_t i = start; i < vcount; i++) {
		idx_t parent_index = state.parent_index + i;
		if (parent && !parent->is_empty.empty() && parent->is_empty[parent_index]) {
			state.definition_levels.push_back(parent->definition_levels[parent_index]);
			state.repetition_levels.push_back(parent->repetition_levels[parent_index]);
			state.is_empty.push_back(true);
			continue;
		}
		auto first_repeat_level =
		    parent && !parent->repetition_levels.empty() ? parent->repetition_levels[parent_index] : MaxRepeat();
		if (parent && parent->definition_levels[parent_index] != PARQUET_DEFINE_VALID) {
			state.definition_levels.push_back(parent->definition_levels[parent_index]);
			state.repetition_levels.push_back(first_repeat_level);
			state.is_empty.push_back(false);
			for (idx_t k = 1; k < array_size; k++) {
				state.repetition_levels.push_back(MaxRepeat() + 1);
				state.definition_levels.push_back(parent->definition_levels[parent_index]);
				state.is_empty.push_back(false);
			}
		} else if (validity.RowIsValid(vector_index)) {
			// push the repetition levels
			state.definition_levels.push_back(PARQUET_DEFINE_VALID);
			state.is_empty.push_back(false);

			state.repetition_levels.push_back(first_repeat_level);
			for (idx_t k = 1; k < array_size; k++) {
				state.repetition_levels.push_back(MaxRepeat() + 1);
				state.definition_levels.push_back(PARQUET_DEFINE_VALID);
				state.is_empty.push_back(false);
			}
		} else {
			state.definition_levels.push_back(MaxDefine() - 1);
			state.repetition_levels.push_back(first_repeat_level);
			state.is_empty.push_back(false);
			for (idx_t k = 1; k < array_size; k++) {
				state.repetition_levels.push_back(MaxRepeat() + 1);
				state.definition_levels.push_back(MaxDefine() - 1);
				state.is_empty.push_back(false);
			}
		}
		vector_index++;
	}
	state.parent_index += vcount;

	auto &array_child = ArrayVector::GetEntry(vector);
	child_writer->Prepare(*state.child_state, &state_p, array_child, count * array_size);
}